

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto::InternalSwap(DescriptorProto *this,DescriptorProto *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  uint32 uVar1;
  string *psVar2;
  MessageOptions *pMVar3;
  UnknownFieldSet *other_00;
  Arena *arena;
  ArenaStringPtr *this_02;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->field_).super_RepeatedPtrFieldBase,&(other->field_).super_RepeatedPtrFieldBase)
  ;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             &(other->nested_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_range_).super_RepeatedPtrFieldBase,
             &(other->extension_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->oneof_decl_).super_RepeatedPtrFieldBase,
             &(other->oneof_decl_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->reserved_range_).super_RepeatedPtrFieldBase,
             &(other->reserved_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(other->reserved_name_).super_RepeatedPtrFieldBase);
  this_01 = &this->name_;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  this_02 = &other->name_;
  if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_0029c672;
    internal::ArenaStringPtr::CreateInstance
              (this_01,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar2 = this_01->ptr_;
  if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (this_02,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar2);
LAB_0029c672:
  pMVar3 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar3;
  return;
}

Assistant:

void DescriptorProto::InternalSwap(DescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  field_.InternalSwap(&other->field_);
  nested_type_.InternalSwap(&other->nested_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  extension_range_.InternalSwap(&other->extension_range_);
  extension_.InternalSwap(&other->extension_);
  oneof_decl_.InternalSwap(&other->oneof_decl_);
  reserved_range_.InternalSwap(&other->reserved_range_);
  reserved_name_.InternalSwap(&other->reserved_name_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(options_, other->options_);
}